

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::RenderLineStrip<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  ImPlotContext *pIVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double in_XMM1_Qa;
  double dVar10;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  local_60 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar2 = *(int *)(this + 0x10);
    local_48 = iVar2 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = (ImU32)DrawList;
    local_40 = line_weight;
    dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar2 + iVar2) % (long)iVar2 &
                                      0xffffffff);
    iVar2 = *(int *)&getter->Getter;
    local_3c.y = (float)((in_XMM1_Qa - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) *
                         GImPlot->My[iVar2] + (double)GImPlot->PixelRange[iVar2].Min.y);
    local_3c.x = (float)((dVar4 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                        (double)GImPlot->PixelRange[iVar2].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin> *)local_58,
               local_60,&pIVar5->CurrentPlot->PlotRect);
  }
  else {
    iVar2 = *(int *)(this + 0x10);
    dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar2 + iVar2) % (long)iVar2 &
                                      0xffffffff);
    iVar2 = *(int *)&getter->Getter;
    dVar10 = (in_XMM1_Qa - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) * GImPlot->My[iVar2] +
             (double)GImPlot->PixelRange[iVar2].Min.y;
    fVar8 = (float)dVar10;
    dVar10 = (double)CONCAT44((int)((ulong)dVar10 >> 0x20),fVar8);
    local_58._4_4_ = fVar8;
    local_58._0_4_ =
         (float)((dVar4 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                (double)GImPlot->PixelRange[iVar2].Min.x);
    iVar2 = *(int *)(this + 0x10);
    if (1 < iVar2) {
      iVar6 = 1;
      do {
        dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                          (long)((*(int *)(this + 0x14) + iVar6) % iVar2 + iVar2) %
                                          (long)iVar2 & 0xffffffff);
        iVar2 = *(int *)&getter->Getter;
        fVar7 = (float)((dVar4 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                       (double)GImPlot->PixelRange[iVar2].Min.x);
        fVar9 = (float)((dVar10 - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) * GImPlot->My[iVar2]
                       + (double)GImPlot->PixelRange[iVar2].Min.y);
        local_68.y = fVar9;
        local_68.x = fVar7;
        pIVar3 = pIVar5->CurrentPlot;
        dVar10 = (double)(ulong)(uint)fVar9;
        fVar8 = (float)local_58._4_4_;
        if (fVar9 <= (float)local_58._4_4_) {
          fVar8 = fVar9;
        }
        if ((fVar8 < (pIVar3->PlotRect).Max.y) &&
           (fVar8 = (float)(~-(uint)(fVar9 <= (float)local_58._4_4_) & (uint)fVar9 |
                           local_58._4_4_ & -(uint)(fVar9 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar8 && fVar8 != *pfVar1)) {
          dVar10 = (double)(ulong)(uint)fVar7;
          fVar8 = (float)local_58._0_4_;
          if (fVar7 <= (float)local_58._0_4_) {
            fVar8 = fVar7;
          }
          if ((fVar8 < (pIVar3->PlotRect).Max.x) &&
             (fVar8 = (float)(~-(uint)(fVar7 <= (float)local_58._0_4_) & (uint)fVar7 |
                             local_58._0_4_ & -(uint)(fVar7 <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar8 && fVar8 != (pIVar3->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,(ImU32)DrawList,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar6 = iVar6 + 1;
        iVar2 = *(int *)(this + 0x10);
      } while (iVar6 < iVar2);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}